

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x64SAR(uchar *stream,x86Reg reg,int num)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *start;
  int num_local;
  x86Reg reg_local;
  uchar *stream_local;
  
  if ((char)num == num) {
    uVar2 = encodeRex(stream,true,rNONE,rNONE,reg);
    puVar3 = stream + uVar2;
    *puVar3 = 0xc1;
    uVar1 = encodeRegister(reg,'\a');
    puVar3[1] = uVar1;
    uVar2 = encodeImmByte(puVar3 + 2,(char)num);
    return ((int)(puVar3 + 2) + uVar2) - (int)stream;
  }
  __assert_fail("char(num) == num",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,0x6a4,"int x64SAR(unsigned char *, x86Reg, int)");
}

Assistant:

int x64SAR(unsigned char *stream, x86Reg reg, int num)
{
	unsigned char *start = stream;

	assert(char(num) == num);

	stream += encodeRex(stream, true, rNONE, rNONE, reg);
	*stream++ = 0xc1;
	*stream++ = encodeRegister(reg, 7);
	stream += encodeImmByte(stream, (char)num);

	return int(stream - start);
}